

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O1

MPP_RET iep2_start(iep2_api_ctx *ctx)

{
  uint uVar1;
  MPP_RET *pMVar2;
  char *pcVar3;
  MPP_RET MVar4;
  MppReqV1 mpp_req [2];
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 local_48;
  undefined8 uStack_40;
  iep2_api_ctx *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  iep2_output *local_20;
  
  if (ctx == (iep2_api_ctx *)0x0) {
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"ctx","iep2_start",
               CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x17c));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  local_48 = 0x100000200;
  uStack_40 = 0x290;
  local_30 = 0x201;
  uStack_2c = 3;
  uStack_28 = 0x19c;
  uStack_24 = 0;
  local_20 = &ctx->output;
  local_38 = ctx;
  if (((byte)iep_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"iep:in\n",(char *)0x0);
  }
  MVar4 = MPP_OK;
  uVar1 = ioctl(ctx->fd,0x40047601,&local_48);
  if (uVar1 != 0) {
    pMVar2 = __errno_location();
    MVar4 = *pMVar2;
    pcVar3 = strerror(MVar4);
    _mpp_log_l(2,(char *)0x0,"ioctl SET_REG failed ret %d errno %d %s\n","iep2_start",(ulong)uVar1,
               (ulong)(uint)MVar4,pcVar3);
    MVar4 = *pMVar2;
  }
  return MVar4;
}

Assistant:

static MPP_RET iep2_start(struct iep2_api_ctx *ctx)
{
    MPP_RET ret;
    MppReqV1 mpp_req[2];

    mpp_assert(ctx);

    mpp_req[0].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[0].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[0].size =  sizeof(ctx->params);
    mpp_req[0].offset = 0;
    mpp_req[0].data_ptr = REQ_DATA_PTR(&ctx->params);

    mpp_req[1].cmd = MPP_CMD_SET_REG_READ;
    mpp_req[1].flag = MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    mpp_req[1].size =  sizeof(ctx->output);
    mpp_req[1].offset = 0;
    mpp_req[1].data_ptr = REQ_DATA_PTR(&ctx->output);

    iep_dbg_func("in\n");

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req[0]);

    if (ret) {
        mpp_err_f("ioctl SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    return ret;
}